

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttkern.c
# Opt level: O0

FT_Int tt_face_get_kerning(TT_Face face,FT_UInt left_glyph,FT_UInt right_glyph)

{
  FT_Byte *pFVar1;
  byte *pbVar2;
  short sVar3;
  uint uVar4;
  FT_Byte *pFVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  FT_ULong key_1;
  FT_UInt count2;
  FT_ULong key;
  FT_Byte *q;
  uint local_78;
  FT_UInt mid;
  FT_UInt max;
  FT_UInt min;
  FT_ULong key0;
  uint local_60;
  FT_Int value;
  FT_UInt num_pairs;
  FT_UInt coverage;
  FT_UInt length;
  FT_UInt version;
  FT_Byte *next;
  FT_Byte *base;
  FT_Byte *p_limit;
  FT_Byte *p;
  FT_UInt local_28;
  FT_UInt mask;
  FT_UInt count;
  FT_Int result;
  FT_UInt right_glyph_local;
  FT_UInt left_glyph_local;
  TT_Face face_local;
  
  mask = 0;
  if (face->kern_table == (FT_Byte *)0x0) {
    face_local._4_4_ = 0;
  }
  else {
    pFVar5 = face->kern_table + face->kern_table_size;
    p_limit = face->kern_table + 4;
    p._4_4_ = 1;
    for (local_28 = face->num_kern_tables; local_28 != 0 && p_limit + 6 <= pFVar5;
        local_28 = local_28 - 1) {
      pFVar1 = p_limit + 4;
      pbVar2 = p_limit + 5;
      _length = p_limit + CONCAT11(p_limit[2],p_limit[3]);
      if (pFVar5 < p_limit + CONCAT11(p_limit[2],p_limit[3])) {
        _length = pFVar5;
      }
      if ((face->kern_avail_bits & p._4_4_) != 0) {
        local_60 = (uint)CONCAT11(p_limit[6],p_limit[7]);
        p_limit = p_limit + 0xe;
        if ((long)_length - (long)p_limit < (long)(int)(local_60 * 6)) {
          local_60 = (uint)(((long)_length - (long)p_limit) / 6);
        }
        if (*pFVar1 == '\0') {
          uVar6 = (ulong)left_glyph << 0x10 | (ulong)right_glyph;
          if ((face->kern_order_bits & p._4_4_) == 0) {
            key_1._4_4_ = local_60;
LAB_0032dbc8:
            if (key_1._4_4_ != 0) {
              if (((uint)*p_limit << 0x18 | (uint)p_limit[1] << 0x10 | (uint)p_limit[2] << 8 |
                  (uint)p_limit[3]) != uVar6) goto LAB_0032dc4c;
              sVar3 = CONCAT11(p_limit[4],p_limit[5]);
LAB_0032dc74:
              key0._4_4_ = (FT_UInt)sVar3;
              if ((*pbVar2 & 8) == 0) {
                mask = key0._4_4_ + mask;
              }
              else {
                mask = key0._4_4_;
              }
            }
            goto LAB_0032dc92;
          }
          mid = 0;
          local_78 = local_60;
          uVar4 = local_78;
          while (local_78 = uVar4, mid < local_78) {
            uVar4 = mid + local_78 >> 1;
            pbVar7 = p_limit + uVar4 * 6;
            uVar8 = (ulong)((uint)*pbVar7 << 0x18 | (uint)pbVar7[1] << 0x10 | (uint)pbVar7[2] << 8 |
                           (uint)pbVar7[3]);
            if (uVar8 == uVar6) {
              sVar3 = CONCAT11(pbVar7[4],pbVar7[5]);
              goto LAB_0032dc74;
            }
            if (uVar8 < uVar6) {
              mid = uVar4 + 1;
              uVar4 = local_78;
            }
          }
        }
      }
LAB_0032dc92:
      p_limit = _length;
      p._4_4_ = p._4_4_ << 1;
    }
    face_local._4_4_ = mask;
  }
  return face_local._4_4_;
LAB_0032dc4c:
  p_limit = p_limit + 6;
  key_1._4_4_ = key_1._4_4_ - 1;
  goto LAB_0032dbc8;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  tt_face_get_kerning( TT_Face  face,
                       FT_UInt  left_glyph,
                       FT_UInt  right_glyph )
  {
    FT_Int   result = 0;
    FT_UInt  count, mask;

    FT_Byte*  p;
    FT_Byte*  p_limit;


    if ( !face->kern_table )
      return result;

    p       = face->kern_table;
    p_limit = p + face->kern_table_size;

    p   += 4;
    mask = 0x0001;

    for ( count = face->num_kern_tables;
          count > 0 && p + 6 <= p_limit;
          count--, mask <<= 1 )
    {
      FT_Byte* base     = p;
      FT_Byte* next;
      FT_UInt  version  = FT_NEXT_USHORT( p );
      FT_UInt  length   = FT_NEXT_USHORT( p );
      FT_UInt  coverage = FT_NEXT_USHORT( p );
      FT_UInt  num_pairs;
      FT_Int   value    = 0;

      FT_UNUSED( version );


      next = base + length;

      if ( next > p_limit )  /* handle broken table */
        next = p_limit;

      if ( ( face->kern_avail_bits & mask ) == 0 )
        goto NextTable;

      FT_ASSERT( p + 8 <= next ); /* tested in tt_face_load_kern */

      num_pairs = FT_NEXT_USHORT( p );
      p        += 6;

      if ( ( next - p ) < 6 * (int)num_pairs )  /* handle broken count  */
        num_pairs = (FT_UInt)( ( next - p ) / 6 );

      switch ( coverage >> 8 )
      {
      case 0:
        {
          FT_ULong  key0 = TT_KERN_INDEX( left_glyph, right_glyph );


          if ( face->kern_order_bits & mask )   /* binary search */
          {
            FT_UInt   min = 0;
            FT_UInt   max = num_pairs;


            while ( min < max )
            {
              FT_UInt   mid = ( min + max ) >> 1;
              FT_Byte*  q   = p + 6 * mid;
              FT_ULong  key;


              key = FT_NEXT_ULONG( q );

              if ( key == key0 )
              {
                value = FT_PEEK_SHORT( q );
                goto Found;
              }
              if ( key < key0 )
                min = mid + 1;
              else
                max = mid;
            }
          }
          else /* linear search */
          {
            FT_UInt  count2;


            for ( count2 = num_pairs; count2 > 0; count2-- )
            {
              FT_ULong  key = FT_NEXT_ULONG( p );


              if ( key == key0 )
              {
                value = FT_PEEK_SHORT( p );
                goto Found;
              }
              p += 2;
            }
          }
        }
        break;

       /*
        * We don't support format 2 because we haven't seen a single font
        * using it in real life...
        */

      default:
        ;
      }

      goto NextTable;

    Found:
      if ( coverage & 8 ) /* override or add */
        result = value;
      else
        result += value;

    NextTable:
      p = next;
    }

    return result;
  }